

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O1

void assert_throws_macro_passes_pointer_type(void)

{
  string *psVar1;
  char *pcVar2;
  undefined8 *puVar3;
  size_type __dnew;
  size_type local_20;
  
  psVar1 = (string *)operator_new(0x20);
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  local_20 = 0x1e;
  pcVar2 = (char *)std::__cxx11::string::_M_create((ulong *)psVar1,(ulong)&local_20);
  (psVar1->_M_dataplus)._M_p = pcVar2;
  (psVar1->field_2)._M_allocated_capacity = local_20;
  builtin_strncpy(pcVar2,"pointer_throwing_function test",0x1e);
  psVar1->_M_string_length = local_20;
  (psVar1->_M_dataplus)._M_p[local_20] = '\0';
  exception_pointer_abi_cxx11_ = psVar1;
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = exception_pointer_abi_cxx11_;
  __cxa_throw(puVar3,&std::__cxx11::string*::typeinfo,0);
}

Assistant:

static void pointer_throwing_function(void) {
    exception_pointer = new std::string("pointer_throwing_function test");
    throw exception_pointer;
}